

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

FString C_GetMassCVarString(DWORD filter,bool compact)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  FString *pFVar3;
  undefined4 extraout_var_00;
  int in_EDX;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  FString *this;
  FBaseCVar *pFVar4;
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  TArray<FBaseCVar_*,_FBaseCVar_*> local_38;
  
  this = (FString *)CONCAT44(in_register_0000003c,filter);
  this->Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar1 = (uint)CONCAT71(in_register_00000031,compact);
  pFVar4 = CVars;
  if (in_EDX == 0) {
    for (; pFVar4 != (FBaseCVar *)0x0; pFVar4 = pFVar4->m_Next) {
      if ((pFVar4->Flags & 0x5000) == 0 && (pFVar4->Flags & uVar1) != 0) {
        iVar2 = (*pFVar4->_vptr_FBaseCVar[4])(pFVar4,3);
        pFVar3 = FString::operator+=(this,'\\');
        pFVar3 = FString::operator+=(pFVar3,pFVar4->Name);
        pFVar3 = FString::operator+=(pFVar3,'\\');
        FString::operator+=(pFVar3,(char *)CONCAT44(extraout_var_00,iVar2));
      }
    }
  }
  else {
    local_38.Array = (FBaseCVar **)0x0;
    local_38.Most = 0;
    local_38.Count = 0;
    FString::AppendFormat(this,"\\\\%ux",CONCAT71(in_register_00000031,compact) & 0xffffffff);
    FilterCompactCVars(&local_38,uVar1);
    while (local_38.Count != 0) {
      uVar1 = local_38.Count - 1;
      local_38.Count = uVar1;
      iVar2 = (*local_38.Array[uVar1]->_vptr_FBaseCVar[4])(local_38.Array[uVar1],3);
      pFVar3 = FString::operator+=(this,'\\');
      FString::operator+=(pFVar3,(char *)CONCAT44(extraout_var,iVar2));
    }
    TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray(&local_38);
  }
  return (FString)(char *)this;
}

Assistant:

FString C_GetMassCVarString (DWORD filter, bool compact)
{
	FBaseCVar *cvar;
	FString dump;

	if (compact)
	{
		TArray<FBaseCVar *> cvars;
		dump.AppendFormat("\\\\%ux", filter);
		FilterCompactCVars(cvars, filter);
		while (cvars.Pop (cvar))
		{
			UCVarValue val = cvar->GetGenericRep(CVAR_String);
			dump << '\\' << val.String;
		}
	}
	else
	{
		for (cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
		{
			if ((cvar->Flags & filter) && !(cvar->Flags & (CVAR_NOSAVE|CVAR_IGNORE)))
			{
				UCVarValue val = cvar->GetGenericRep(CVAR_String);
				dump << '\\' << cvar->GetName() << '\\' << val.String;
			}
		}
	}
	return dump;
}